

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditPrivate::removeAction(QLineEditPrivate *this,QAction *action)

{
  bool bVar1;
  QLineEdit *pQVar2;
  reference pvVar3;
  iterator slot;
  Object *in_RSI;
  QLineEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetAction *a;
  SideWidgetEntryList *list;
  QLineEdit *q;
  SideWidgetLocation location;
  SideWidgetEntry entry;
  code *in_stack_ffffffffffffff38;
  QLineEditPrivate *in_stack_ffffffffffffff40;
  vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  *in_stack_ffffffffffffff48;
  vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  *in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff68;
  QLineEditPrivate *in_stack_ffffffffffffff70;
  QLineEditPrivate *in_stack_ffffffffffffff78;
  ConnectionType type;
  QLineEditPrivate *sender;
  Connection local_48;
  offset_in_QLineEdit_to_subr in_stack_ffffffffffffffd0;
  SideWidgetLocation local_28;
  QWidget *local_20;
  QAction *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sender = in_RDI;
  pQVar2 = q_func(in_RDI);
  type = (ConnectionType)((ulong)pQVar2 >> 0x20);
  local_28 = (SideWidgetLocation)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = findSideWidget(in_stack_ffffffffffffff70,
                            (QAction *)in_stack_ffffffffffffff68._M_current);
  bVar1 = SideWidgetLocation::isValid(&local_28);
  if (bVar1) {
    local_20 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = (QAction *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pvVar3 = std::
             vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
             ::operator[](in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    local_20 = pvVar3->widget;
    local_18 = pvVar3->action;
    local_10 = *(undefined1 **)&pvVar3->flags;
    slot = std::
           vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           ::begin((vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                    *)in_stack_ffffffffffffff40);
    __gnu_cxx::
    __normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
    ::operator+((__normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                 *)in_stack_ffffffffffffff48,(difference_type)in_stack_ffffffffffffff40);
    __gnu_cxx::
    __normal_iterator<QLineEditPrivate::SideWidgetEntry_const*,std::vector<QLineEditPrivate::SideWidgetEntry,std::allocator<QLineEditPrivate::SideWidgetEntry>>>
    ::__normal_iterator<QLineEditPrivate::SideWidgetEntry*>
              ((__normal_iterator<const_QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                *)in_stack_ffffffffffffff40,
               (__normal_iterator<QLineEditPrivate::SideWidgetEntry_*,_std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>_>
                *)in_stack_ffffffffffffff38);
    std::
    vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>::
    erase(in_stack_ffffffffffffff48,in_stack_ffffffffffffff68);
    if (((ulong)local_10 & 2) == 0) {
      if (local_20 != (QWidget *)0x0) {
        (**(code **)(*(long *)local_20 + 0x20))();
      }
    }
    else {
      in_stack_ffffffffffffff78 =
           (QLineEditPrivate *)qobject_cast<QWidgetAction*>((QObject *)0x5d493e);
      if (in_stack_ffffffffffffff78 != (QLineEditPrivate *)0x0) {
        QWidgetAction::releaseWidget
                  ((QWidgetAction *)in_RDI,(QWidget *)in_stack_ffffffffffffff68._M_current);
      }
    }
    positionSideWidgets(in_stack_ffffffffffffff78);
    bVar1 = hasSideWidgets(in_stack_ffffffffffffff40);
    if (!bVar1) {
      in_stack_ffffffffffffff38 = textChanged;
      QObjectPrivate::
      connect<void(QLineEdit::*)(QString_const&),void(QLineEditPrivate::*)(QString_const&)>
                ((Object *)sender,in_stack_ffffffffffffffd0,in_RSI,(Function)slot._M_current,type);
      QMetaObject::Connection::~Connection(&local_48);
    }
    QWidget::update((QWidget *)in_stack_ffffffffffffff38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::removeAction(QAction *action)
{
    Q_Q(QLineEdit);
    const auto location = findSideWidget(action);
    if (!location.isValid())
        return;
    SideWidgetEntryList &list = location.position == QLineEdit::TrailingPosition ? trailingSideWidgets : leadingSideWidgets;
    SideWidgetEntry entry = list[location.index];
    list.erase(list.begin() + location.index);
    if (entry.flags & SideWidgetCreatedByWidgetAction) {
        // If the cast fails, the QAction is in the process of being deleted
        // and has already ceased to be a QWidgetAction; in the process, it
        // will release its widget itself, and calling releaseWidget() here
        // would be UB, so don't:
        if (const auto a = qobject_cast<QWidgetAction*>(entry.action))
            a->releaseWidget(entry.widget);
    } else {
         delete entry.widget;
    }
     positionSideWidgets();
     if (!hasSideWidgets()) // Last widget, remove connection
         QObjectPrivate::connect(q, &QLineEdit::textChanged,
                                 this, &QLineEditPrivate::textChanged);
     q->update();
}